

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
HecrSequential_cyclicRedictionFullMatrix_Test::TestBody
          (HecrSequential_cyclicRedictionFullMatrix_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_250;
  Message local_248;
  double local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  double xs_values [7];
  vec rhs;
  double rhs_values [7];
  TridiagonalMatrix m;
  vec cs;
  double cs_values [7];
  undefined1 local_c0 [8];
  vec bs;
  double bs_values [7];
  vec as;
  double as_values [7];
  int size;
  HecrSequential_cyclicRedictionFullMatrix_Test *this_local;
  
  as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4008000000000000;
  make_vector((vec *)(bs_values + 6),7,
              (double *)
              &as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bs_values[0] = -1.0;
  bs_values[1] = 2.0;
  bs_values[2] = 1.1;
  bs_values[3] = 3.2;
  bs_values[4] = 2.0;
  bs_values[5] = 1.0;
  make_vector((vec *)local_c0,7,
              (double *)
              &bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4000000000000000;
  make_vector((vec *)&m.size,7,
              (double *)
              &cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  TridiagonalMatrix::TridiagonalMatrix
            ((TridiagonalMatrix *)(rhs_values + 6),(vec *)(bs_values + 6),(vec *)local_c0,
             (vec *)&m.size);
  rhs_values[3] = (double)0x4021333333333333;
  rhs_values[4] = 26.0;
  rhs_values[1] = 1.0;
  rhs_values[2] = 0.9;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x401c000000000000;
  rhs_values[0] = 6.5;
  rhs_values[5] = 13.0;
  make_vector((vec *)(xs_values + 6),7,
              (double *)
              &rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  xs_values[2] = 0.0;
  xs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  xs_values[0] = 2.0;
  xs_values[1] = -1.0;
  xs_values[3] = 2.0;
  xs_values[4] = -3.0;
  xs_values[5] = 4.0;
  make_vector((vec *)&solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,7,
              (double *)
              &xs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  cyclic_reduction((vec *)&gtest_ar.message_,(TridiagonalMatrix *)(rhs_values + 6),
                   (vec *)(xs_values + 6));
  local_240 = max_diff((vec *)&solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(vec *)&gtest_ar.message_);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_238,"max_diff(xs, solution)","EPS",&local_240,&EPS);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x79,message);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)(xs_values + 6));
  TridiagonalMatrix::~TridiagonalMatrix((TridiagonalMatrix *)(rhs_values + 6));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&m.size);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)(bs_values + 6));
  return;
}

Assistant:

TEST(HecrSequential, cyclicRedictionFullMatrix)
{
    int size = 7;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 13 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}